

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

void fiber_entry(void *argsp)

{
  size_t sz;
  char *msg;
  FiberArgs *args;
  void *argsp_local;
  
  msg = (char *)argsp;
  args = (FiberArgs *)argsp;
  println("fiber_entry()");
  fiber_switch(*(Fiber **)msg,*(Fiber **)(msg + 8));
  put_str(*(Fiber **)msg,*(Fiber **)(msg + 8),"some string");
  put_str(*(Fiber **)msg,*(Fiber **)(msg + 8),"some other string");
  println("again fiber_entry()");
  fiber_reserve_return(*(Fiber **)(msg + 8),run_put_str,(void **)&sz,0x10000);
  memset((void *)sz,0,0x10000);
  strcpy((char *)sz,"Pushed onto toplevel fiber");
  fiber_switch(*(Fiber **)msg,*(Fiber **)(msg + 8));
  return;
}

Assistant:

static void
fiber_entry(void *argsp)
{
    FiberArgs *args = (FiberArgs *) argsp;
    println("fiber_entry()");
    fiber_switch(args->self, args->caller);

    put_str(args->self, args->caller, "some string");
    put_str(args->self, args->caller, "some other string");

    println("again fiber_entry()");
    char *msg;
    size_t sz = 64 * 1024;
    fiber_reserve_return(args->caller, run_put_str, (void **) &msg, sz);
    memset(msg, 0, sz);
    strcpy(msg, "Pushed onto toplevel fiber");
    fiber_switch(args->self, args->caller);
}